

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_async_notification_event_init(ma_async_notification_event *pNotificationEvent)

{
  ma_result result;
  ma_async_notification_event *pNotificationEvent_local;
  
  if (pNotificationEvent == (ma_async_notification_event *)0x0) {
    pNotificationEvent_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    (pNotificationEvent->cb).onSignal = ma_async_notification_event__on_signal;
    pNotificationEvent_local._4_4_ = ma_event_init(&pNotificationEvent->e);
    if (pNotificationEvent_local._4_4_ == MA_SUCCESS) {
      pNotificationEvent_local._4_4_ = MA_SUCCESS;
    }
  }
  return pNotificationEvent_local._4_4_;
}

Assistant:

MA_API ma_result ma_async_notification_event_init(ma_async_notification_event* pNotificationEvent)
{
    if (pNotificationEvent == NULL) {
        return MA_INVALID_ARGS;
    }

    pNotificationEvent->cb.onSignal = ma_async_notification_event__on_signal;

    #ifndef MA_NO_THREADING
    {
        ma_result result;

        result = ma_event_init(&pNotificationEvent->e);
        if (result != MA_SUCCESS) {
            return result;
        }

        return MA_SUCCESS;
    }
    #else
    {
        return MA_NOT_IMPLEMENTED;  /* Threading is disabled. */
    }
    #endif
}